

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getDerivative<(TasGrid::TypeOneDRule)15>
                 (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double x)

{
  double dVar1;
  size_t i;
  size_t inode;
  double dVar2;
  vector<double,_std::allocator<double>_> lag;
  double local_58;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  evalLagrange((vector<double,_std::allocator<double>_> *)&local_48,&current->nodes,&current->coeff,
               x);
  local_58 = 0.0;
  for (inode = 0;
      (long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3 != inode; inode = inode + 1) {
    dVar1 = local_48._M_impl.super__Vector_impl_data._M_start[inode];
    dVar2 = differentiateBasis(&current->nodes,&current->coeff,inode,x);
    local_58 = local_58 + dVar2 * *(double *)(&DAT_001cb090 + (ulong)(0.0 <= dVar1) * 8);
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return local_58;
}

Assistant:

double getDerivative<rule_maxlebesgue>(CurrentNodes<rule_maxlebesgue> const& current, double x){
    std::vector<double> lag = evalLagrange(current.nodes, current.coeff, x);
    double sum = 0.0;
    for(size_t i=0; i<lag.size(); i++)
        sum += Maths::sign(lag[i]) * differentiateBasis(current.nodes, current.coeff, i, x);
    return sum;
}